

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateTopKLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  undefined8 layer_00;
  bool bVar1;
  int iVar2;
  Result *pRVar3;
  string *psVar4;
  mapped_type_conflict1 *pmVar5;
  TopKLayerParams *this_00;
  Tensor *this_01;
  int64 iVar6;
  bool local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  string err_1;
  int rank;
  TopKLayerParams *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string err;
  _Self local_110;
  _Self local_108;
  _Self local_100;
  allocator local_f1;
  string local_f0;
  Result local_d0;
  Result local_a8;
  undefined4 local_80;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,2);
  pRVar3 = Result::operator=((Result *)local_48,&local_70);
  bVar1 = Result::good(pRVar3);
  Result::~Result(&local_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,2,2);
    pRVar3 = Result::operator=((Result *)local_48,&local_a8);
    bVar1 = Result::good(pRVar3);
    Result::~Result(&local_a8);
    layer_00 = r.m_message.field_2._8_8_;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"TopK",&local_f1);
      validateInputOutputRankEquality
                (&local_d0,(NeuralNetworkLayer *)layer_00,&local_f0,&this->blobNameToRank);
      pRVar3 = Result::operator=((Result *)local_48,&local_d0);
      bVar1 = Result::good(pRVar3);
      Result::~Result(&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
        local_100._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this->blobNameToRank,psVar4);
        local_108._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(&this->blobNameToRank);
        bVar1 = std::operator!=(&local_100,&local_108);
        local_239 = false;
        if (bVar1) {
          psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,1);
          local_110._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->blobNameToRank,psVar4);
          err.field_2._8_8_ =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->blobNameToRank);
          local_239 = std::operator!=(&local_110,(_Self *)((long)&err.field_2 + 8));
        }
        if (local_239 != false) {
          psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(&this->blobNameToRank,psVar4);
          iVar2 = *pmVar5;
          psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,1);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(&this->blobNameToRank,psVar4);
          if (iVar2 != *pmVar5) {
            std::__cxx11::string::string((string *)local_138);
            psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::__cxx11::string::string((string *)&params,(string *)psVar4);
            std::operator+(&local_178,"Layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params);
            std::operator+(&local_158,&local_178,
                           "\' of type \'TopK\' expects equal ranks for its input and second output, but they are not equal."
                          );
            std::__cxx11::string::operator=((string *)local_138,(string *)&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&params);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
            local_80 = 1;
            std::__cxx11::string::~string((string *)local_138);
            goto LAB_00a4304c;
          }
        }
        iVar2 = Specification::NeuralNetworkLayer::inputtensor_size
                          ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        if (0 < iVar2) {
          this_00 = Specification::NeuralNetworkLayer::topk
                              ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          this_01 = Specification::NeuralNetworkLayer::inputtensor
                              ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
          err_1.field_2._12_4_ = Specification::Tensor::rank(this_01);
          iVar6 = Specification::TopKLayerParams::axis(this_00);
          if ((iVar6 < (int)-err_1.field_2._12_4_) ||
             (iVar6 = Specification::TopKLayerParams::axis(this_00),
             (int)err_1.field_2._12_4_ <= iVar6)) {
            psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::operator+(&local_1e8,
                           "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                           ,psVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8,&local_1e8,"\' layer.");
            std::__cxx11::string::~string((string *)&local_1e8);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1c8);
            local_80 = 1;
            std::__cxx11::string::~string((string *)local_1c8);
            goto LAB_00a4304c;
          }
        }
        Result::Result(__return_storage_ptr__);
        local_80 = 1;
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_80 = 1;
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_80 = 1;
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_80 = 1;
  }
LAB_00a4304c:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateTopKLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 2)).good()) return r;
    if (!(r = validateOutputCount(layer, 2, 2)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "TopK", blobNameToRank)).good()) return r;

    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(1)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(1))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type 'TopK' expects equal ranks for its input and second output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.topk();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}